

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

exitcode rifiuti_cleanup(GError **error)

{
  _Bool _Var1;
  exitcode eVar2;
  exitcode eVar3;
  
  if (error == (GError **)0x0) {
    g_return_if_fail_warning("rifiuti2","rifiuti_cleanup","error != NULL");
    eVar3 = EXIT_ERR_UNHANDLED;
  }
  else {
    eVar2 = _get_exit_code(*error);
    g_clear_error(error);
    _Var1 = _has_record_error();
    eVar3 = EXIT_ERR_DUBIOUS_DATA;
    if (eVar2 != EXIT_OK) {
      eVar3 = eVar2;
    }
    if (!_Var1) {
      eVar3 = eVar2;
    }
    g_log("rifiuti2",0x80,"Final cleanup...");
    g_ptr_array_unref(meta->records);
    g_hash_table_destroy(meta->invalid_records);
    g_free(meta->filename);
    g_free(meta);
    g_ptr_array_free(allidxfiles,1);
    g_strfreev(fileargs);
    g_free(output_loc);
    g_free(legacy_encoding);
    g_free(delim);
    close_handles();
  }
  return eVar3;
}

Assistant:

exitcode
rifiuti_cleanup   (GError   **error)
{
    exitcode code = EXIT_OK;

    g_return_val_if_fail (error != NULL, EXIT_ERR_UNHANDLED);

    code = _get_exit_code ((const GError *) (*error));
    g_clear_error (error);

    if (_has_record_error () && code == EXIT_OK)
        code = EXIT_ERR_DUBIOUS_DATA;

    g_debug ("Final cleanup...");

    g_ptr_array_unref (meta->records);
    g_hash_table_destroy (meta->invalid_records);
    g_free (meta->filename);
    g_free (meta);

    g_ptr_array_free (allidxfiles, TRUE);
    g_strfreev (fileargs);
    g_free (output_loc);
    g_free (legacy_encoding);
    g_free (delim);

    close_handles ();

#ifdef G_OS_WIN32
    cleanup_windows_res ();
#endif

    return code;
}